

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Function<kj::MainBuilder::Validity_(kj::StringPtr)> * __thiscall
kj::Arena::
allocate<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>,kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>
          (Arena *this,Function<kj::MainBuilder::Validity_(kj::StringPtr)> *params)

{
  Iface *pIVar1;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *ptr;
  
  ptr = (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)allocateBytes(this,0x10,8,true);
  pIVar1 = (params->impl).ptr;
  (ptr->impl).disposer = (params->impl).disposer;
  (ptr->impl).ptr = pIVar1;
  (params->impl).ptr = (Iface *)0x0;
  setDestructor(this,ptr,destroyObject<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>);
  return ptr;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}